

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_counter_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c0738::DebugCounterTest_RealProvidesReportAtExit_Test::
DebugCounterTest_RealProvidesReportAtExit_Test(DebugCounterTest_RealProvidesReportAtExit_Test *this)

{
  DebugCounterTest_RealProvidesReportAtExit_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__DebugCounterTest_RealProvidesReportAtExit_Test_029a3670;
  return;
}

Assistant:

TEST(DebugCounterTest, RealProvidesReportAtExit) {
  EXPECT_EXIT(
      {
        static google::protobuf::internal::RealDebugCounter counter1("Foo.Bar");
        static google::protobuf::internal::RealDebugCounter counter2("Foo.Baz");
        static google::protobuf::internal::RealDebugCounter counter3("Num.32");
        static google::protobuf::internal::RealDebugCounter counter4("Num.128");
        counter1.Inc();
        counter2.Inc();
        counter2.Inc();
        counter3.Inc();
        counter3.Inc();
        counter3.Inc();
        counter4.Inc();
        exit(0);
      },
      ExitedWithCode(0), MatchOutput(true));
}